

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DropFaceNormalsProcess.cpp
# Opt level: O3

bool __thiscall
Assimp::DropFaceNormalsProcess::DropMeshFaceNormals(DropFaceNormalsProcess *this,aiMesh *pMesh)

{
  aiVector3D *paVar1;
  
  paVar1 = pMesh->mNormals;
  if (paVar1 != (aiVector3D *)0x0) {
    operator_delete__(paVar1);
    pMesh->mNormals = (aiVector3D *)0x0;
  }
  return paVar1 != (aiVector3D *)0x0;
}

Assistant:

bool DropFaceNormalsProcess::DropMeshFaceNormals (aiMesh* pMesh) {
    if (NULL == pMesh->mNormals) {
        return false;
    }
    
    delete[] pMesh->mNormals;
    pMesh->mNormals = nullptr;
    return true;
}